

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool __thiscall GrcManager::Compile(GrcManager *this,GrcFont *param_1,char *pchOutputPath)

{
  if (this->m_fPassOptimizations == true) {
    PassOptimizations(this);
  }
  if (this->m_fVerbose == true) {
    std::operator<<((ostream *)&std::cout,"[Generating FSMs: ");
  }
  GenerateFsms(this,pchOutputPath);
  if (this->m_fVerbose == true) {
    std::operator<<((ostream *)&std::cout,"]\n");
  }
  CalculateContextOffsets(this);
  CalculateGlatVersion(this);
  return false;
}

Assistant:

bool GrcManager::Compile(GrcFont * /*pfont*/, char * pchOutputPath)
{
	if (IncludePassOptimizations())
		PassOptimizations();
	if (this->IsVerbose())
		std::cout << "[Generating FSMs: ";
	GenerateFsms(pchOutputPath);
	if (this->IsVerbose())
		std::cout << "]\n";
	CalculateContextOffsets();	// after max-rule-context has been set
	CalculateGlatVersion();		// before outputting debug files
	return false;
}